

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O2

void * LOADLoadLibraryDirect(LPCSTR libraryNameOrPath)

{
  void *pvVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  if (libraryNameOrPath == (LPCSTR)0x0) {
    pcVar3 = "libraryNameOrPath != nullptr";
    uVar2 = 0x54b;
  }
  else {
    if (*libraryNameOrPath != '\0') {
      pvVar1 = (void *)dlopen(libraryNameOrPath,1);
      if (pvVar1 == (void *)0x0) {
        uVar2 = dlerror();
        printf("dlopen() failed; dlerror says \'%s\'\n",uVar2);
        SetLastError(0x7e);
      }
      else if (PAL_InitializeChakraCoreCalled == false) {
        abort();
      }
      return pvVar1;
    }
    pcVar3 = "libraryNameOrPath[0] != \'\\0\'";
    uVar2 = 0x54c;
  }
  fprintf(_stderr,"ASSERTION (%s, line %d) %s %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/loader/module.cpp"
          ,uVar2,pcVar3,"");
  fflush(_stderr);
  abort();
}

Assistant:

static void *LOADLoadLibraryDirect(LPCSTR libraryNameOrPath)
{
    _ASSERTE(libraryNameOrPath != nullptr);
    _ASSERTE(libraryNameOrPath[0] != '\0');

    void *dl_handle = dlopen(libraryNameOrPath, RTLD_LAZY);
    if (dl_handle == nullptr)
    {
        printf("dlopen() failed; dlerror says '%s'\n", dlerror());
        SetLastError(ERROR_MOD_NOT_FOUND);
    }
    else
    {
        TRACE("dlopen() found module %s\n", libraryNameOrPath);
    }

    return dl_handle;
}